

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O0

string * infoEntryTypeToString_abi_cxx11_(HighsInfoType type)

{
  int in_ESI;
  string *in_RDI;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int64_t",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"HighsInt",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"double",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  return in_RDI;
}

Assistant:

static std::string infoEntryTypeToString(const HighsInfoType type) {
  if (type == HighsInfoType::kInt64) {
    return "int64_t";
  } else if (type == HighsInfoType::kInt) {
    return "HighsInt";
  } else {
    return "double";
  }
}